

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngine.cpp
# Opt level: O0

void __thiscall llbuild::core::BuildEngine::resetForBuild(BuildEngine *this)

{
  BuildEngine *this_local;
  
  anon_unknown.dwarf_359b51::BuildEngineImpl::resetForBuild((BuildEngineImpl *)this->impl);
  return;
}

Assistant:

void BuildEngine::resetForBuild() {
  static_cast<BuildEngineImpl*>(impl)->resetForBuild();
}